

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          *args_1,SyntaxNode **args_2)

{
  group_type_pointer pgVar1;
  size_t *psVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  uint uVar5;
  ushort uVar6;
  char *pcVar7;
  long lVar8;
  group_type_pointer pgVar9;
  ulong uVar10;
  ulong uVar11;
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
  *ppVar12;
  undefined1 auVar13 [16];
  
  pgVar9 = __return_storage_ptr__->pg;
  uVar11 = (ulong)__return_storage_ptr__->n;
  ppVar12 = __return_storage_ptr__->p;
  lVar8 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar3 = arrays_->groups_ + pos0;
    auVar13[0] = -(pgVar3->m[0].n == '\0');
    auVar13[1] = -(pgVar3->m[1].n == '\0');
    auVar13[2] = -(pgVar3->m[2].n == '\0');
    auVar13[3] = -(pgVar3->m[3].n == '\0');
    auVar13[4] = -(pgVar3->m[4].n == '\0');
    auVar13[5] = -(pgVar3->m[5].n == '\0');
    auVar13[6] = -(pgVar3->m[6].n == '\0');
    auVar13[7] = -(pgVar3->m[7].n == '\0');
    auVar13[8] = -(pgVar3->m[8].n == '\0');
    auVar13[9] = -(pgVar3->m[9].n == '\0');
    auVar13[10] = -(pgVar3->m[10].n == '\0');
    auVar13[0xb] = -(pgVar3->m[0xb].n == '\0');
    auVar13[0xc] = -(pgVar3->m[0xc].n == '\0');
    auVar13[0xd] = -(pgVar3->m[0xd].n == '\0');
    auVar13[0xe] = -(pgVar3->m[0xe].n == '\0');
    auVar13[0xf] = -(pgVar3->m[0xf].n == '\0');
    uVar6 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
    if (uVar6 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      ppVar4 = arrays_->elements_;
      uVar5 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar11 = (ulong)uVar5;
      uVar10 = (ulong)(uVar5 << 5);
      ppVar12 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
                 *)((long)&ppVar4[pos0 * 0xf].first.
                           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                           super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
                   uVar10);
      *(Scope **)
       ((long)&ppVar4[pos0 * 0xf].first.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
               super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl + uVar10) =
           (args_1->
           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
           ).super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
           super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
      pcVar7 = (args_1->
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               ).super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
               ._M_head_impl._M_str;
      psVar2 = (size_t *)
               ((long)&ppVar4[pos0 * 0xf].first.
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       .
                       super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                       ._M_head_impl._M_len + uVar10);
      *psVar2 = (args_1->
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                ).
                super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
                _M_head_impl._M_len;
      psVar2[1] = (size_t)pcVar7;
      *(SyntaxNode **)((long)&ppVar4[pos0 * 0xf].second + uVar10) = *args_2;
      pgVar1->m[uVar11].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar9 = pgVar1;
    }
    if (uVar6 != 0) break;
    pos0 = pos0 + lVar8 & arrays_->groups_size_mask;
    lVar8 = lVar8 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar11;
  __return_storage_ptr__->p = ppVar12;
  __return_storage_ptr__->pg = pgVar9;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }